

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestExpectation.cpp
# Opt level: O0

void __thiscall psy::C::Decl::Decl(Decl *this)

{
  Decl *this_local;
  
  std::__cxx11::string::string((string *)this);
  Ty::Ty(&this->ty_,this);
  return;
}

Assistant:

Decl::Decl()
    : ty_(*this)
{}